

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.c
# Opt level: O1

void * get_component(ecs_entity_info_t *info,ecs_entity_t component)

{
  short sVar1;
  short sVar2;
  ecs_vector_t *peVar3;
  ecs_data_t *peVar4;
  ecs_column_t *peVar5;
  uint uVar6;
  void *pvVar7;
  int16_t offset;
  long lVar8;
  ulong uVar9;
  
  _ecs_assert(info->table != (ecs_table_t *)0x0,0xc,(char *)0x0,"info->table != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/entity.c"
              ,0x35);
  if (info->table == (ecs_table_t *)0x0) {
    __assert_fail("info->table != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                  ,0x35,"void *get_component(ecs_entity_info_t *, ecs_entity_t)");
  }
  _ecs_assert(component != 0,0xc,(char *)0x0,"component != 0",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/entity.c"
              ,0x36);
  if (component == 0) {
    __assert_fail("component != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                  ,0x36,"void *get_component(ecs_entity_info_t *, ecs_entity_t)");
  }
  _ecs_assert((_Bool)((byte)~(byte)((uint)info->row >> 0x18) >> 7),0xc,(char *)0x0,"info->row >= 0",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/entity.c"
              ,0x37);
  if (info->row < 0) {
    __assert_fail("info->row >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                  ,0x37,"void *get_component(ecs_entity_info_t *, ecs_entity_t)");
  }
  peVar3 = info->table->type;
  pvVar7 = _ecs_vector_first(peVar3,8,0x10);
  uVar6 = ecs_vector_count(peVar3);
  if (0 < (int)uVar6) {
    lVar8 = 10;
    uVar9 = 0;
    do {
      if (*(ecs_entity_t *)((long)pvVar7 + uVar9 * 8) == component) {
        peVar4 = info->data;
        _ecs_assert(peVar4 != (ecs_data_t *)0x0,0xc,(char *)0x0,"data != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                    ,0x13);
        if (peVar4 == (ecs_data_t *)0x0) {
          __assert_fail("data != ((void*)0)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                        ,0x13,"void *get_component_w_index(ecs_entity_info_t *, int32_t)");
        }
        peVar5 = peVar4->columns;
        _ecs_assert(peVar5 != (ecs_column_t *)0x0,0xc,(char *)0x0,"columns != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                    ,0x16);
        if (peVar5 == (ecs_column_t *)0x0) {
          __assert_fail("columns != ((void*)0)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                        ,0x16,"void *get_component_w_index(ecs_entity_info_t *, int32_t)");
        }
        _ecs_assert((int)uVar9 < info->table->column_count,3,(char *)0x0,
                    "index < info->table->column_count",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                    ,0x17);
        if (info->table->column_count <= (int)uVar9) {
          __assert_fail("index < info->table->column_count",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                        ,0x17,"void *get_component_w_index(ecs_entity_info_t *, int32_t)");
        }
        peVar3 = *(ecs_vector_t **)((long)peVar5 + lVar8 + -10);
        sVar1 = *(short *)((long)peVar5 + lVar8 + -2);
        _ecs_assert(sVar1 != 0,2,(char *)0x0,"size != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                    ,0x1f);
        if (sVar1 == 0) {
          __assert_fail("size != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                        ,0x1f,"void *get_component_w_index(ecs_entity_info_t *, int32_t)");
        }
        _ecs_assert(peVar3 != (ecs_vector_t *)0x0,0xc,(char *)0x0,"data_vec != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                    ,0x24);
        if (peVar3 == (ecs_vector_t *)0x0) {
          __assert_fail("data_vec != ((void*)0)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                        ,0x24,"void *get_component_w_index(ecs_entity_info_t *, int32_t)");
        }
        sVar2 = *(short *)((long)&peVar5->data + lVar8);
        offset = 0x10;
        if (0x10 < sVar2) {
          offset = sVar2;
        }
        pvVar7 = _ecs_vector_first(peVar3,(int)sVar1,offset);
        _ecs_assert(pvVar7 != (void *)0x0,0xc,(char *)0x0,"ptr != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                    ,0x2a);
        if (pvVar7 == (void *)0x0) {
          __assert_fail("ptr != ((void*)0)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                        ,0x2a,"void *get_component_w_index(ecs_entity_info_t *, int32_t)");
        }
        return (void *)((long)(int)sVar1 * (long)info->row + (long)pvVar7);
      }
      uVar9 = uVar9 + 1;
      lVar8 = lVar8 + 0x10;
    } while (uVar6 != uVar9);
  }
  return (void *)0x0;
}

Assistant:

static
void* get_component(
    ecs_entity_info_t *info,
    ecs_entity_t component)
{
    ecs_assert(info->table != NULL, ECS_INTERNAL_ERROR, NULL);
    ecs_assert(component != 0, ECS_INTERNAL_ERROR, NULL);
    ecs_assert(info->row >= 0, ECS_INTERNAL_ERROR, NULL);

    ecs_table_t *table = info->table;
    ecs_type_t type = table->type;

    ecs_entity_t *ids = ecs_vector_first(type, ecs_entity_t);

    /* The table column_count contains the maximum column index that actually
     * contains data. This excludes component ids that do not have data, such
     * as tags. Therefore it is faster to iterate column_count vs. all the
     * elements in the type.
     *
     * The downside of this is that the code can't always detect when an 
     * application attempts to get the value of a tag (which is not allowed). To
     * ensure consistent behavior in debug mode, the entire type is iterated as
     * this guarantees that the code will assert when attempting to obtain the
     * value of a tag. */
#ifndef NDEBUG
    int i, count = ecs_vector_count(type);
#else
    int i, count = table->column_count;
#endif

    for (i = 0; i < count; i ++) {
        if (ids[i] == component) {
            return get_component_w_index(info, i);
        }
    }

    return NULL;
}